

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * __thiscall JSON::JSONValue::getStringValue_abi_cxx11_(JSONValue *this)

{
  JSONValueType JVar1;
  ostream *poVar2;
  allocator<char> local_61;
  string local_60;
  string local_30;
  JSONValue *local_10;
  JSONValue *this_local;
  
  local_10 = this;
  JVar1 = getType(this);
  if (JVar1 != STRING) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON string value from ");
    getTypeAsString_abi_cxx11_(&local_30,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    poVar2 = std::operator<<(poVar2,"in accessor");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    setStringValue(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return (string *)this->data;
}

Assistant:

string &JSONValue::getStringValue() {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=STRING)
	{
	cerr << "Error requesting JSON string value from " << getTypeAsString() << "in accessor" << endl;
	setStringValue("");
	}
#endif
	return *((string*)data);
}